

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Value Am_Show_Dialog_And_Wait(Am_Object *the_dialog,bool modal)

{
  bool bVar1;
  Am_Method_Wrapper *pAVar2;
  Am_Object *this;
  byte in_DL;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  undefined7 in_register_00000031;
  Am_Value AVar3;
  Am_Object local_40;
  undefined1 local_35;
  Am_Object local_28;
  Am_Object cmd;
  bool modal_local;
  Am_Object *the_dialog_local;
  Am_Value *v;
  
  cmd.data._7_1_ = in_DL & 1;
  Am_Object::Peek_Object
            (&local_28,(Am_Slot_Key)(Am_Object *)CONCAT71(in_register_00000031,modal),0xc5);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_stop_waiting_for_dialog);
    this = Am_Object::Set(&local_28,0xca,pAVar2,1);
    pAVar2 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_abort_waiting_for_dialog);
    Am_Object::Set(this,0xc9,pAVar2,1);
  }
  local_35 = 0;
  Am_Value::Am_Value((Am_Value *)the_dialog);
  Am_Object::Am_Object(&local_40,(Am_Object *)CONCAT71(in_register_00000031,modal));
  Am_Pop_Up_Window_And_Wait(&local_40,(Am_Value *)the_dialog,(bool)(cmd.data._7_1_ & 1));
  Am_Object::~Am_Object(&local_40);
  local_35 = 1;
  Am_Object::~Am_Object(&local_28);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = the_dialog;
  return AVar3;
}

Assistant:

Am_Value
Am_Show_Dialog_And_Wait(Am_Object the_dialog, bool modal /*= false*/)
{
  Am_Object cmd = the_dialog.Peek_Object(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_DO_METHOD, do_stop_waiting_for_dialog, Am_OK_IF_NOT_THERE)
        .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog,
             Am_OK_IF_NOT_THERE);
  }
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(the_dialog, v, modal);
  return v;
}